

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch_extraction_by_swipe.cc
# Opt level: O2

bool __thiscall
sptk::PitchExtractionBySwipe::Get
          (PitchExtractionBySwipe *this,vector<double,_std::allocator<double>_> *waveform,
          vector<double,_std::allocator<double>_> *f0,
          vector<double,_std::allocator<double>_> *epochs,Polarity *polarity)

{
  pointer pdVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  pointer pdVar6;
  double *__src;
  double *extraout_RDX;
  double *extraout_RDX_00;
  double *pdVar7;
  bool bVar8;
  double dVar9;
  undefined1 auVar10 [16];
  vector vVar11;
  
  if ((this->is_valid_ == true) &&
     ((waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish)) {
    bVar8 = true;
    if (f0 != (vector<double,_std::allocator<double>_> *)0x0) {
      vVar11 = swipe::swipe(waveform,this->sampling_rate_,this->lower_f0_,this->upper_f0_,
                            this->voicing_threshold_,
                            (double)this->frame_shift_ / this->sampling_rate_);
      __src = vVar11.v;
      lVar4 = (long)(waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
      lVar5 = lVar4 >> 3;
      auVar10._8_4_ = (int)(lVar4 >> 0x23);
      auVar10._0_8_ = lVar5;
      auVar10._12_4_ = 0x45300000;
      dVar9 = ceil(((auVar10._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) /
                   (double)this->frame_shift_);
      uVar3 = (uint)dVar9;
      uVar2 = vVar11.x;
      if ((int)uVar3 <= vVar11.x) {
        uVar2 = uVar3;
      }
      std::vector<double,_std::allocator<double>_>::resize(f0,(long)(int)uVar3);
      lVar4 = (long)(int)uVar2;
      pdVar7 = extraout_RDX;
      if (uVar2 != 0) {
        memmove((f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start,__src,lVar4 * 8);
        pdVar7 = extraout_RDX_00;
      }
      pdVar1 = (f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      dVar9 = __src[lVar4 + -1];
      for (pdVar6 = (f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start + lVar4; pdVar6 != pdVar1; pdVar6 = pdVar6 + 1)
      {
        *pdVar6 = dVar9;
      }
      vVar11.v = pdVar7;
      vVar11._0_8_ = __src;
      swipe::freev((swipe *)(ulong)uVar2,vVar11);
    }
  }
  else {
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool PitchExtractionBySwipe::Get(
    const std::vector<double>& waveform, std::vector<double>* f0,
    std::vector<double>* epochs,
    PitchExtractionInterface::Polarity* polarity) const {
  // Check inputs.
  if (!is_valid_ || waveform.empty()) {
    return false;
  }

  if (NULL != f0) {
    swipe::vector tmp_f0(swipe::swipe(
        waveform, sampling_rate_, lower_f0_, upper_f0_, voicing_threshold_,
        static_cast<double>(frame_shift_) / sampling_rate_));
    const int target_length(static_cast<int>(
        std::ceil(static_cast<double>(waveform.size()) / frame_shift_)));
    if (target_length < tmp_f0.x) {
      tmp_f0.x = target_length;
    }
    f0->resize(target_length);
    std::copy(tmp_f0.v, tmp_f0.v + tmp_f0.x, f0->begin());
    std::fill(f0->begin() + tmp_f0.x, f0->end(), tmp_f0.v[tmp_f0.x - 1]);
    swipe::freev(tmp_f0);
  }

  if (NULL != epochs) {
    // nothing to do
  }

  if (NULL != polarity) {
    // nothing to do
  }

  return true;
}